

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O1

void __thiscall soul::CodeLocation::CodeLocation(CodeLocation *this,Ptr *code)

{
  SourceCodeText *pSVar1;
  
  (this->sourceCode).object = code->object;
  code->object = (SourceCodeText *)0x0;
  pSVar1 = (this->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (this->location).data = (pSVar1->utf8).data;
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x47);
}

Assistant:

CodeLocation::CodeLocation (SourceCodeText::Ptr code)  : sourceCode (std::move (code)), location (sourceCode->utf8) {}